

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcpsdespacket.cpp
# Opt level: O0

void __thiscall
jrtplib::RTCPSDESPacket::RTCPSDESPacket(RTCPSDESPacket *this,uint8_t *data,size_t datalength)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  size_t itemlen;
  size_t addoffset;
  size_t r;
  RTCPSDESHeader *sdeshdr;
  bool done;
  uint8_t *puStack_40;
  int chunkoffset;
  uint8_t *chunk;
  int ssrccount;
  uint8_t padcount;
  size_t len;
  RTCPCommonHeader *hdr;
  size_t datalength_local;
  uint8_t *data_local;
  RTCPSDESPacket *this_local;
  
  RTCPPacket::RTCPPacket(&this->super_RTCPPacket,SDES,data,datalength);
  (this->super_RTCPPacket)._vptr_RTCPPacket = (_func_int **)&PTR__RTCPSDESPacket_001ad968;
  (this->super_RTCPPacket).knownformat = false;
  this->currentchunk = (uint8_t *)0x0;
  this->itemoffset = 0;
  this->curchunknum = 0;
  _ssrccount = datalength;
  if ((*data >> 5 & 1) != 0) {
    bVar1 = data[datalength - 1];
    if ((bVar1 & 3) != 0) {
      return;
    }
    if (datalength <= bVar1) {
      return;
    }
    _ssrccount = datalength - bVar1;
  }
  if ((*data & 0x1f) == 0) {
    if (_ssrccount != 4) {
      return;
    }
  }
  else {
    chunk._0_4_ = (uint)(*data & 0x1f);
    if (_ssrccount < 4) {
      return;
    }
    _ssrccount = _ssrccount - 4;
    puStack_40 = data + 4;
    for (; 0 < (int)(uint)chunk && _ssrccount != 0; chunk._0_4_ = (uint)chunk - 1) {
      if (_ssrccount < 8) {
        return;
      }
      _ssrccount = _ssrccount - 4;
      sdeshdr._4_4_ = 4;
      bVar2 = false;
      while (!bVar2) {
        if (_ssrccount == 0) {
          return;
        }
        if (puStack_40[(int)sdeshdr._4_4_] == '\0') {
          _ssrccount = _ssrccount - 1;
          sdeshdr._4_4_ = sdeshdr._4_4_ + 1;
          if ((long)(int)(sdeshdr._4_4_ & 3) != 0) {
            uVar3 = 4 - (long)(int)(sdeshdr._4_4_ & 3);
            if (_ssrccount < uVar3) {
              return;
            }
            _ssrccount = _ssrccount - uVar3;
            sdeshdr._4_4_ = sdeshdr._4_4_ + (int)uVar3;
          }
          bVar2 = true;
        }
        else {
          if (_ssrccount < 2) {
            return;
          }
          bVar1 = (puStack_40 + (int)sdeshdr._4_4_)[1];
          if (_ssrccount - 2 < (ulong)bVar1) {
            return;
          }
          _ssrccount = (_ssrccount - 2) - (ulong)bVar1;
          sdeshdr._4_4_ = sdeshdr._4_4_ + 2 + (uint)bVar1;
        }
      }
      puStack_40 = puStack_40 + (int)sdeshdr._4_4_;
    }
    if (_ssrccount != 0) {
      return;
    }
    if (0 < (int)(uint)chunk) {
      return;
    }
  }
  (this->super_RTCPPacket).knownformat = true;
  return;
}

Assistant:

RTCPSDESPacket::RTCPSDESPacket(uint8_t *data,size_t datalength)
	: RTCPPacket(SDES,data,datalength)
{
	knownformat = false;
	currentchunk = 0;
	itemoffset = 0;
	curchunknum = 0;
		
	RTCPCommonHeader *hdr = (RTCPCommonHeader *)data;
	size_t len = datalength;
	
	if (hdr->padding)
	{
		uint8_t padcount = data[datalength-1];
		if ((padcount & 0x03) != 0) // not a multiple of four! (see rfc 3550 p 37)
			return;
		if (((size_t)padcount) >= len)
			return;
		len -= (size_t)padcount;
	}
	
	if (hdr->count == 0)
	{
		if (len != sizeof(RTCPCommonHeader))
			return;
	}
	else
	{
		int ssrccount = (int)(hdr->count);
		uint8_t *chunk;
		int chunkoffset;
		
		if (len < sizeof(RTCPCommonHeader))
			return;
		
		len -= sizeof(RTCPCommonHeader);
		chunk = data+sizeof(RTCPCommonHeader);
		
		while ((ssrccount > 0) && (len > 0))
		{
			if (len < (sizeof(uint32_t)*2)) // chunk must contain at least a SSRC identifier
				return;                  // and a (possibly empty) item
			
			len -= sizeof(uint32_t);
			chunkoffset = sizeof(uint32_t);

			bool done = false;
			while (!done)
			{
				if (len < 1) // at least a zero byte (end of item list) should be there
					return;
				
				RTCPSDESHeader *sdeshdr = (RTCPSDESHeader *)(chunk+chunkoffset);
				if (sdeshdr->sdesid == 0) // end of item list
				{
					len--;
					chunkoffset++;

					size_t r = (chunkoffset&0x03);
					if (r != 0)
					{
						size_t addoffset = 4-r;
					
						if (addoffset > len)
							return;
						len -= addoffset;
						chunkoffset += addoffset;
					}
					done = true;
				}
				else
				{
					if (len < sizeof(RTCPSDESHeader))
						return;
					
					len -= sizeof(RTCPSDESHeader);
					chunkoffset += sizeof(RTCPSDESHeader);
					
					size_t itemlen = (size_t)(sdeshdr->length);
					if (itemlen > len)
						return;
					
					len -= itemlen;
					chunkoffset += itemlen;
				}		
			}
			
			ssrccount--;
			chunk += chunkoffset;
		}

		// check for remaining bytes
		if (len > 0)
			return;
		if (ssrccount > 0)
			return;
	}

	knownformat = true;
}